

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O1

void __thiscall optimization::livevar_analyse::Livevar_Analyse::build(Livevar_Analyse *this)

{
  bool bVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if ((this->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar2 = std::_Rb_tree_decrement
                      (&(this->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ee370;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[2]._M_use_count = 0;
    this_00[2]._M_weak_count = 0;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[3]._M_use_count = 0;
    this_00[3]._M_weak_count = 0;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[1]._M_use_count = 0;
    this_00[1]._M_weak_count = 0;
    *(_Atomic_word **)&this_00[2]._M_use_count = &this_00[1]._M_use_count;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)&this_00[1]._M_use_count;
    this_00[3]._M_use_count = 0;
    this_00[3]._M_weak_count = 0;
    do {
      bVar1 = bfs_build(this,(BasicBlk *)(lVar2 + 0x28));
    } while (bVar1);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void build() {
    if (!func.basic_blks.size()) {
      return;
    }

    auto end = func.basic_blks.end();
    end--;
    sharedPtrVariableSet empty = std::make_shared<VariableSet>();
    while (bfs_build(end->second))
      ;

    // for (auto& pair : livevars) {
    //   LOG(TRACE) << pair.first << ": " << std::endl;
    //   for (auto var : *pair.second->live_vars_in) {
    //     LOG(TRACE) << var << ", ";
    //   }
    //   LOG(TRACE) << std::endl;
    //   for (auto ilv : pair.second->instLiveVars) {
    //     for (auto var : *ilv) {
    //       LOG(TRACE) << var << ", ";
    //     }
    //     LOG(TRACE) << std::endl;
    //   }
    //   LOG(TRACE) << "******************" << std::endl;
    // }
  }